

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

const_iterator * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::const_iterator::operator++(const_iterator *this)

{
  slot_type *pptVar1;
  
  if ((this->iter_).inner_ != (Inner *)0x0) {
    pptVar1 = (this->iter_).it_.field_1.slot_;
    (this->iter_).it_.ctrl_ = (this->iter_).it_.ctrl_ + 1;
    (this->iter_).it_.field_1.slot_ = pptVar1 + 1;
    raw_hash_set<phmap::priv::NodeHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::iterator::skip_empty_or_deleted(&(this->iter_).it_);
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::iterator::skip_empty(&this->iter_);
    return this;
  }
  __assert_fail("inner_",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0xa95,
                "iterator &phmap::priv::parallel_hash_set<4, phmap::priv::raw_hash_set, phmap::NullMutex, phmap::priv::NodeHashMapPolicy<unsigned long, unsigned long>, phmap::priv::(anonymous namespace)::Hash, phmap::priv::(anonymous namespace)::Eq, std::allocator<std::pair<const unsigned long, unsigned long>>>::iterator::operator++() [N = 4, RefSet = phmap::priv::raw_hash_set, Mtx_ = phmap::NullMutex, Policy = phmap::priv::NodeHashMapPolicy<unsigned long, unsigned long>, Hash = phmap::priv::(anonymous namespace)::Hash, Eq = phmap::priv::(anonymous namespace)::Eq, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
               );
}

Assistant:

iterator& operator++() {
            assert(inner_); // null inner means we are already at the end
            ++it_;
            skip_empty();
            return *this;
        }